

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::GCDMIVTest
          (LoopDependenceAnalysis *this,
          pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *subscript_pair)

{
  SENode *node;
  SENode *node_00;
  bool bVar1;
  int64_t iVar2;
  int64_t iVar3;
  long lVar4;
  long lVar5;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  dest_recurrences;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  source_recurrences;
  vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
  source_constants;
  vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
  dest_constants;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  local_88;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  local_70;
  vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_> local_58
  ;
  vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_> local_40
  ;
  
  node = subscript_pair->first;
  node_00 = subscript_pair->second;
  bVar1 = anon_unknown_15::IsInCorrectFormForGCDTest(node);
  if ((!bVar1) || (bVar1 = anon_unknown_15::IsInCorrectFormForGCDTest(node_00), !bVar1)) {
    return false;
  }
  anon_unknown_15::GetAllTopLevelRecurrences(&local_70,node);
  anon_unknown_15::GetAllTopLevelRecurrences(&local_88,node_00);
  bVar1 = anon_unknown_15::AreOffsetsAndCoefficientsConstant(&local_70);
  if ((bVar1) && (bVar1 = anon_unknown_15::AreOffsetsAndCoefficientsConstant(&local_88), bVar1)) {
    anon_unknown_15::GetAllTopLevelConstants(&local_58,node);
    iVar2 = anon_unknown_15::CalculateConstantTerm(&local_70,&local_58);
    anon_unknown_15::GetAllTopLevelConstants(&local_40,node_00);
    iVar3 = anon_unknown_15::CalculateConstantTerm(&local_88,&local_40);
    lVar5 = iVar2 - iVar3;
    lVar4 = -lVar5;
    if (0 < lVar5) {
      lVar4 = lVar5;
    }
    iVar2 = anon_unknown_15::CalculateGCDFromCoefficients(&local_70,0);
    iVar2 = anon_unknown_15::CalculateGCDFromCoefficients(&local_88,iVar2);
    bVar1 = lVar4 % iVar2 != 0;
    if (local_40.
        super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.
                      super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_40.
                            super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.
                            super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_58.
        super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar1 = false;
  }
  if (local_88.
      super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.
      super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
    return bVar1;
  }
  operator_delete(local_70.
                  super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (long)local_70.
                        super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_70.
                        super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  return bVar1;
}

Assistant:

bool LoopDependenceAnalysis::GCDMIVTest(
    const std::pair<SENode*, SENode*>& subscript_pair) {
  auto source = std::get<0>(subscript_pair);
  auto destination = std::get<1>(subscript_pair);

  // Bail out if source/destination is in an unexpected form.
  if (!IsInCorrectFormForGCDTest(source) ||
      !IsInCorrectFormForGCDTest(destination)) {
    return false;
  }

  auto source_recurrences = GetAllTopLevelRecurrences(source);
  auto dest_recurrences = GetAllTopLevelRecurrences(destination);

  // Bail out if all offsets and coefficients aren't constant.
  if (!AreOffsetsAndCoefficientsConstant(source_recurrences) ||
      !AreOffsetsAndCoefficientsConstant(dest_recurrences)) {
    return false;
  }

  // Calculate the GCD of all coefficients.
  auto source_constants = GetAllTopLevelConstants(source);
  int64_t source_constant =
      CalculateConstantTerm(source_recurrences, source_constants);

  auto dest_constants = GetAllTopLevelConstants(destination);
  int64_t destination_constant =
      CalculateConstantTerm(dest_recurrences, dest_constants);

  int64_t delta = std::abs(source_constant - destination_constant);

  int64_t running_gcd = 0;

  running_gcd = CalculateGCDFromCoefficients(source_recurrences, running_gcd);
  running_gcd = CalculateGCDFromCoefficients(dest_recurrences, running_gcd);

  return delta % running_gcd != 0;
}